

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double eval_guided_crit_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong __n;
  MissingAction missing_action_00;
  size_t ix;
  long lVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  double *pdVar4;
  size_t sVar5;
  double *pdVar6;
  long lVar7;
  size_t *ix_arr_00;
  size_t *psVar8;
  double dVar9;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar10;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  allocator_type local_71;
  size_t *local_70;
  ulong local_68;
  double local_60;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  size_t local_38;
  
  missing_action_00 = missing_action;
  psVar8 = buffer_pos;
  pdVar4 = buffer_arr;
  local_58 = min_gain;
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  local_68 = end - st;
  __n = local_68 + 1;
  lVar7 = end * 8 + st * -8;
  sVar5 = 0;
  for (lVar1 = lVar7 + 8; lVar1 != 0; lVar1 = lVar1 + -8) {
    psVar8[sVar5] = sVar5;
    sVar5 = sVar5 + 1;
  }
  ix_arr_00 = psVar8;
  if (missing_action == Impute) {
    missing_action_00 = Fail;
    uVar2 = 0;
    do {
      ix_arr_00 = buffer_pos;
      local_70 = ix_arr;
      if (__n == uVar2) goto LAB_0029e7ce;
      pdVar6 = pdVar4 + uVar2;
      uVar2 = uVar2 + 1;
    } while ((ulong)ABS(*pdVar6) < 0x7ff0000000000000);
    puVar3 = (unsigned_long *)((long)buffer_pos + (__n & 0xfffffffffffffffe) * 4);
    std::
    nth_element<unsigned_long*,eval_guided_crit_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>
              (buffer_pos,puVar3,psVar8 + local_68 + 1,(anon_class_8_1_0f1c67a0)&buffer_arr);
    dVar9 = buffer_arr[*puVar3];
    *saved_xmedian = dVar9;
    pdVar4 = buffer_arr;
    uVar2 = __n;
    if ((local_68 & 1) != 0) {
      local_60 = dVar9;
      puVar3 = std::__max_element<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                         (buffer_pos,puVar3);
      dVar9 = ((double)CONCAT44(0x45300000,(int)(*puVar3 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)*puVar3) - 4503599627370496.0);
      *saved_xmedian = (local_60 - dVar9) * 0.5 + dVar9;
      pdVar4 = buffer_arr;
    }
    while (uVar2 != 0) {
      pdVar6 = saved_xmedian;
      if ((ulong)ABS(*pdVar4) < 0x7ff0000000000000) {
        pdVar6 = pdVar4;
      }
      *pdVar4 = *pdVar6;
      pdVar4 = pdVar4 + 1;
      uVar2 = uVar2 - 1;
    }
    missing_action_00 = Fail;
    sVar5 = 0;
    for (lVar7 = lVar7 + 8; ix_arr_00 = buffer_pos, ix_arr = local_70, lVar7 != 0;
        lVar7 = lVar7 + -8) {
      buffer_pos[sVar5] = sVar5;
      sVar5 = sVar5 + 1;
    }
  }
LAB_0029e7ce:
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,__n,&local_71);
  psVar8 = ix_arr + st;
  for (lVar1 = 0; st + lVar1 <= end; lVar1 = lVar1 + 1) {
    pVar10 = tsl::detail_robin_hash::
             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
             ::try_emplace<unsigned_long_const&>
                       ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         *)w,psVar8);
    local_50._M_impl.super__Vector_impl_data._M_start[lVar1] =
         *(double *)((pVar10.first.m_bucket.m_bucket)->m_value + 8);
    psVar8 = psVar8 + 1;
  }
  dVar9 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,long_double>
                    (ix_arr_00,0,local_68,buffer_arr,buffer_arr + __n,as_relative_gain,saved_xmedian
                     ,(double *)0x0,&local_38,split_point,xmin,xmax,criterion,local_58,
                     missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,ncols,Xr,Xr_ind
                     ,Xr_indptr,(vector<double,_std::allocator<double>_> *)&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return dVar9;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}